

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O0

array<unsigned_long,_4UL> * kmer_bw_neighbours(uint64_t kmer,uint8_t k)

{
  array<unsigned_long,_4UL> *this;
  reference pvVar1;
  char in_DL;
  ulong in_RSI;
  array<unsigned_long,_4UL> *in_RDI;
  uint64_t i;
  size_type in_stack_ffffffffffffffc8;
  undefined8 local_18;
  
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    this = (array<unsigned_long,_4UL> *)
           ((in_RSI >> 2) + (local_18 << ((in_DL + -1) * '\x02' & 0x3fU)));
    pvVar1 = std::array<unsigned_long,_4UL>::operator[](this,in_stack_ffffffffffffffc8);
    *pvVar1 = (value_type_conflict1)this;
  }
  return in_RDI;
}

Assistant:

std::array<uint64_t,4> kmer_bw_neighbours(uint64_t kmer, uint8_t k) {
    std::array<uint64_t,4> n;
    for (uint64_t i=0;i<4;++i){
        n[i]=(kmer>>2)+(((uint64_t) i)<<((k-1)*2));
    }
//    std::cout<<"Produced BW neighbours for "<<kmer_to_sequence(kmer,k)<<std::endl;
//    std::cout<<" for A: "<<kmer_to_sequence(n[0],k)<<std::endl;
//    std::cout<<" for C: "<<kmer_to_sequence(n[1],k)<<std::endl;
//    std::cout<<" for G: "<<kmer_to_sequence(n[2],k)<<std::endl;
//    std::cout<<" for T: "<<kmer_to_sequence(n[3],k)<<std::endl;
    return n;
}